

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterNext(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  long lVar1;
  byte bVar2;
  u16 uVar3;
  int iVar4;
  int iVar5;
  int *pRc;
  Fts5Buffer *pBuf;
  size_t sVar6;
  uint local_68;
  int local_64;
  int nSz;
  int nList;
  char *zTerm;
  u8 *pList;
  u64 iDelta;
  u8 *puStack_40;
  int n;
  u8 *a;
  int local_30;
  int nKeep;
  int bNewTerm;
  int iOff;
  Fts5Data *pLeaf;
  int *pbNewTerm_local;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  _bNewTerm = pIter->pLeaf;
  local_30 = 0;
  a._4_4_ = 0;
  puStack_40 = _bNewTerm->p;
  iDelta._4_4_ = _bNewTerm->szLeaf;
  iVar4 = pIter->iLeafOffset + pIter->nPos;
  nKeep = iVar4;
  pLeaf = (Fts5Data *)pbNewTerm;
  pbNewTerm_local = (int *)pIter;
  pIter_local = (Fts5SegIter *)p;
  if (iVar4 < iDelta._4_4_) {
    if (iVar4 < pIter->iEndofDoclist) {
      bVar2 = sqlite3Fts5GetVarint(puStack_40 + iVar4,(u64 *)&pList);
      nKeep = (uint)bVar2 + nKeep;
      *(u8 **)(pbNewTerm_local + 0x1a) = pList + *(long *)(pbNewTerm_local + 0x1a);
    }
    else {
      local_30 = 1;
      iVar5 = fts5LeafFirstTermOff(_bNewTerm);
      if (iVar4 != iVar5) {
        iVar4 = sqlite3Fts5GetVarint32(puStack_40 + nKeep,(u32 *)((long)&a + 4));
        nKeep = iVar4 + nKeep;
      }
    }
    pbNewTerm_local[8] = nKeep;
  }
  else if (pIter->pSeg == (Fts5StructureSegment *)0x0) {
    zTerm = (char *)0x0;
    _nSz = (u8 *)0x0;
    local_64 = 0;
    if ((pIter->flags & 1U) == 0) {
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry
                ((Fts5Hash *)pIter_local->pNextLeaf,(char **)&nSz,(u8 **)&zTerm,&local_64);
    }
    if (zTerm == (char *)0x0) {
      fts5DataRelease(*(Fts5Data **)(pbNewTerm_local + 4));
      pbNewTerm_local[4] = 0;
      pbNewTerm_local[5] = 0;
    }
    else {
      **(undefined8 **)(pbNewTerm_local + 4) = zTerm;
      *(int *)(*(long *)(pbNewTerm_local + 4) + 8) = local_64;
      *(int *)(*(long *)(pbNewTerm_local + 4) + 0xc) = local_64;
      pbNewTerm_local[0xf] = local_64 + 1;
      pRc = &pIter_local->iTermLeafOffset;
      pBuf = (Fts5Buffer *)(pbNewTerm_local + 0x16);
      sVar6 = strlen((char *)_nSz);
      sqlite3Fts5BufferSet(pRc,pBuf,(int)sVar6,_nSz);
      bVar2 = sqlite3Fts5GetVarint((uchar *)zTerm,(u64 *)(pbNewTerm_local + 0x1a));
      pbNewTerm_local[8] = (uint)bVar2;
      *(undefined4 *)&pLeaf->p = 1;
    }
  }
  else {
    nKeep = 0;
    while (nKeep == 0) {
      fts5SegIterNextPage((Fts5Index *)pIter_local,(Fts5SegIter *)pbNewTerm_local);
      _bNewTerm = *(Fts5Data **)(pbNewTerm_local + 4);
      if (_bNewTerm == (Fts5Data *)0x0) break;
      uVar3 = fts5GetU16(_bNewTerm->p);
      nKeep = (int)uVar3;
      if ((nKeep == 0) || (_bNewTerm->szLeaf <= nKeep)) {
        if (_bNewTerm->szLeaf < _bNewTerm->nn) {
          iVar4 = _bNewTerm->szLeaf;
          iVar5 = sqlite3Fts5GetVarint32(_bNewTerm->p + _bNewTerm->szLeaf,(u32 *)&nKeep);
          pbNewTerm_local[0xe] = iVar4 + iVar5;
          pbNewTerm_local[8] = nKeep;
          pbNewTerm_local[0xf] = nKeep;
          local_30 = 1;
        }
      }
      else {
        bVar2 = sqlite3Fts5GetVarint(_bNewTerm->p + nKeep,(u64 *)(pbNewTerm_local + 0x1a));
        nKeep = (uint)bVar2 + nKeep;
        pbNewTerm_local[8] = nKeep;
        if (_bNewTerm->szLeaf < _bNewTerm->nn) {
          iVar4 = _bNewTerm->szLeaf;
          iVar5 = sqlite3Fts5GetVarint32
                            (_bNewTerm->p + _bNewTerm->szLeaf,(u32 *)(pbNewTerm_local + 0xf));
          pbNewTerm_local[0xe] = iVar4 + iVar5;
        }
      }
      if (_bNewTerm->szLeaf < nKeep) {
        pIter_local->iTermLeafOffset = 0x10b;
        return;
      }
    }
  }
  if (*(long *)(pbNewTerm_local + 4) != 0) {
    if (local_30 == 0) {
      lVar1 = **(long **)(pbNewTerm_local + 4);
      iVar4 = pbNewTerm_local[8];
      pbNewTerm_local[8] = iVar4 + 1;
      bVar2 = *(byte *)(lVar1 + iVar4);
      local_68 = (uint)bVar2;
      if ((bVar2 & 0x80) != 0) {
        pbNewTerm_local[8] = pbNewTerm_local[8] + -1;
        iVar4 = sqlite3Fts5GetVarint32
                          ((uchar *)(**(long **)(pbNewTerm_local + 4) + (long)pbNewTerm_local[8]),
                           &local_68);
        pbNewTerm_local[8] = iVar4 + pbNewTerm_local[8];
      }
      *(byte *)(pbNewTerm_local + 0x1d) = (byte)local_68 & 1;
      pbNewTerm_local[0x1c] = (int)local_68 >> 1;
    }
    else if ((pbNewTerm_local[2] & 1U) == 0) {
      fts5SegIterLoadTerm((Fts5Index *)pIter_local,(Fts5SegIter *)pbNewTerm_local,a._4_4_);
      fts5SegIterLoadNPos((Fts5Index *)pIter_local,(Fts5SegIter *)pbNewTerm_local);
      if (pLeaf != (Fts5Data *)0x0) {
        *(undefined4 *)&pLeaf->p = 1;
      }
    }
    else {
      fts5DataRelease(*(Fts5Data **)(pbNewTerm_local + 4));
      pbNewTerm_local[4] = 0;
      pbNewTerm_local[5] = 0;
    }
  }
  return;
}

Assistant:

static void fts5SegIterNext(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  Fts5Data *pLeaf = pIter->pLeaf;
  int iOff;
  int bNewTerm = 0;
  int nKeep = 0;
  u8 *a;
  int n;

  assert( pbNewTerm==0 || *pbNewTerm==0 );
  assert( p->pConfig->eDetail!=FTS5_DETAIL_NONE );

  /* Search for the end of the position list within the current page. */
  a = pLeaf->p;
  n = pLeaf->szLeaf;

  ASSERT_SZLEAF_OK(pLeaf);
  iOff = pIter->iLeafOffset + pIter->nPos;

  if( iOff<n ){
    /* The next entry is on the current page. */
    assert_nc( iOff<=pIter->iEndofDoclist );
    if( iOff>=pIter->iEndofDoclist ){
      bNewTerm = 1;
      if( iOff!=fts5LeafFirstTermOff(pLeaf) ){
        iOff += fts5GetVarint32(&a[iOff], nKeep);
      }
    }else{
      u64 iDelta;
      iOff += sqlite3Fts5GetVarint(&a[iOff], &iDelta);
      pIter->iRowid += iDelta;
      assert_nc( iDelta>0 );
    }
    pIter->iLeafOffset = iOff;

  }else if( pIter->pSeg==0 ){
    const u8 *pList = 0;
    const char *zTerm = 0;
    int nList = 0;
    assert( (pIter->flags & FTS5_SEGITER_ONETERM) || pbNewTerm );
    if( 0==(pIter->flags & FTS5_SEGITER_ONETERM) ){
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &pList, &nList);
    }
    if( pList==0 ){
      fts5DataRelease(pIter->pLeaf);
      pIter->pLeaf = 0;
    }else{
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList+1;
      sqlite3Fts5BufferSet(&p->rc, &pIter->term, (int)strlen(zTerm),
          (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
      *pbNewTerm = 1;
    }
  }else{
    iOff = 0;
    /* Next entry is not on the current page */
    while( iOff==0 ){
      fts5SegIterNextPage(p, pIter);
      pLeaf = pIter->pLeaf;
      if( pLeaf==0 ) break;
      ASSERT_SZLEAF_OK(pLeaf);
      if( (iOff = fts5LeafFirstRowidOff(pLeaf)) && iOff<pLeaf->szLeaf ){
        iOff += sqlite3Fts5GetVarint(&pLeaf->p[iOff], (u64*)&pIter->iRowid);
        pIter->iLeafOffset = iOff;

        if( pLeaf->nn>pLeaf->szLeaf ){
          pIter->iPgidxOff = pLeaf->szLeaf + fts5GetVarint32(
              &pLeaf->p[pLeaf->szLeaf], pIter->iEndofDoclist
          );
        }
      }
      else if( pLeaf->nn>pLeaf->szLeaf ){
        pIter->iPgidxOff = pLeaf->szLeaf + fts5GetVarint32(
            &pLeaf->p[pLeaf->szLeaf], iOff
        );
        pIter->iLeafOffset = iOff;
        pIter->iEndofDoclist = iOff;
        bNewTerm = 1;
      }
      assert_nc( iOff<pLeaf->szLeaf );
      if( iOff>pLeaf->szLeaf ){
        p->rc = FTS5_CORRUPT;
        return;
      }
    }
  }

  /* Check if the iterator is now at EOF. If so, return early. */
  if( pIter->pLeaf ){
    if( bNewTerm ){
      if( pIter->flags & FTS5_SEGITER_ONETERM ){
        fts5DataRelease(pIter->pLeaf);
        pIter->pLeaf = 0;
      }else{
        fts5SegIterLoadTerm(p, pIter, nKeep);
        fts5SegIterLoadNPos(p, pIter);
        if( pbNewTerm ) *pbNewTerm = 1;
      }
    }else{
      /* The following could be done by calling fts5SegIterLoadNPos(). But
      ** this block is particularly performance critical, so equivalent
      ** code is inlined. 
      **
      ** Later: Switched back to fts5SegIterLoadNPos() because it supports
      ** detail=none mode. Not ideal.
      */
      int nSz;
      assert( p->rc==SQLITE_OK );
      assert( pIter->iLeafOffset<=pIter->pLeaf->nn );
      fts5FastGetVarint32(pIter->pLeaf->p, pIter->iLeafOffset, nSz);
      pIter->bDel = (nSz & 0x0001);
      pIter->nPos = nSz>>1;
      assert_nc( pIter->nPos>=0 );
    }
  }
}